

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O1

IOTHUB_CLIENT_CORE_LL_HANDLE
IoTHubClientCore_LL_CreateFromDeviceAuth
          (char *iothub_uri,char *device_id,IOTHUB_CLIENT_TRANSPORT_PROVIDER protocol)

{
  bool bVar1;
  IOTHUB_CLIENT_CONFIG *client_config;
  char *pcVar2;
  IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *pIVar3;
  LOGGER_LOG p_Var4;
  int iVar5;
  ulong uVar6;
  ulong __n;
  size_t sVar7;
  size_t __n_00;
  char *local_40;
  
  if (((device_id == (char *)0x0) || (iothub_uri == (char *)0x0)) ||
     (protocol == (IOTHUB_CLIENT_TRANSPORT_PROVIDER)0x0)) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0;
    }
    pcVar2 = "Input parameter is NULL: iothub_uri: %p  protocol: %p device_id: %p";
    iVar5 = 0x508;
  }
  else {
    client_config = (IOTHUB_CLIENT_CONFIG *)malloc(0x38);
    if (client_config != (IOTHUB_CLIENT_CONFIG *)0x0) {
      client_config->protocol = (IOTHUB_CLIENT_TRANSPORT_PROVIDER)0x0;
      client_config->deviceId = (char *)0x0;
      client_config->iotHubName = (char *)0x0;
      client_config->iotHubSuffix = (char *)0x0;
      client_config->deviceKey = (char *)0x0;
      client_config->deviceSasToken = (char *)0x0;
      client_config->protocolGatewayHostName = (char *)0x0;
      client_config->protocol = protocol;
      client_config->deviceId = device_id;
      if (iothub_uri != (char *)0x0) {
        uVar6 = 0;
        pcVar2 = (char *)0x0;
        local_40 = (char *)0x0;
        do {
          if (iothub_uri[uVar6] == '.') {
            __n = uVar6;
            if (iothub_uri + uVar6 < iothub_uri) {
              __n = 0xffffffffffffffff;
            }
            sVar7 = __n + 1;
            if (sVar7 == 0) {
              sVar7 = 0xffffffffffffffff;
            }
            if (sVar7 == 0xffffffffffffffff) {
LAB_00120a21:
              p_Var4 = xlogging_get_log_function();
              bVar1 = true;
              if (p_Var4 != (LOGGER_LOG)0x0) {
                (*p_Var4)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                          ,"IoTHubClientCore_LL_CreateFromDeviceAuth",0x540,1,
                          "Failed to allocate iothub name, size:%zu",sVar7);
              }
            }
            else {
              pcVar2 = (char *)calloc(1,sVar7);
              if (pcVar2 == (char *)0x0) {
                pcVar2 = (char *)0x0;
                goto LAB_00120a21;
              }
              memcpy(pcVar2,iothub_uri,__n);
              client_config->iotHubName = pcVar2;
              sVar7 = strlen(iothub_uri);
              __n_00 = (__n ^ 0xffffffffffffffff) + sVar7;
              if (sVar7 < __n) {
                __n_00 = 0xfffffffffffffffe;
              }
              if (sVar7 == __n) {
                __n_00 = 0xffffffffffffffff;
              }
              sVar7 = 0xffffffffffffffff;
              if (__n_00 + 1 != 0) {
                sVar7 = __n_00 + 1;
              }
              if (sVar7 == 0xffffffffffffffff) {
LAB_00120a6b:
                p_Var4 = xlogging_get_log_function();
                if (p_Var4 != (LOGGER_LOG)0x0) {
                  (*p_Var4)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                            ,"IoTHubClientCore_LL_CreateFromDeviceAuth",0x538,1,
                            "Failed to allocate iothub suffix, size:%zu",sVar7);
                }
                free(pcVar2);
                bVar1 = true;
                pcVar2 = (char *)0x0;
              }
              else {
                local_40 = (char *)calloc(1,sVar7);
                if (local_40 == (char *)0x0) {
                  local_40 = (char *)0x0;
                  goto LAB_00120a6b;
                }
                memcpy(local_40,iothub_uri + uVar6 + 1,__n_00);
                client_config->iotHubSuffix = local_40;
                bVar1 = false;
              }
            }
            if (!bVar1) goto LAB_00120b53;
          }
          else if (iothub_uri[uVar6] == '\0') goto LAB_00120b53;
          uVar6 = uVar6 + 1;
        } while( true );
      }
      local_40 = (char *)0x0;
      pcVar2 = (char *)0x0;
LAB_00120b53:
      if ((client_config->iotHubName == (char *)0x0) || (client_config->iotHubSuffix == (char *)0x0)
         ) {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                    ,"IoTHubClientCore_LL_CreateFromDeviceAuth",0x549,1,"initialize iothub client");
        }
        pIVar3 = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)0x0;
      }
      else {
        pIVar3 = initialize_iothub_client
                           (client_config,(IOTHUB_CLIENT_DEVICE_CONFIG *)0x0,true,(char *)0x0);
        if (pIVar3 == (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)0x0) {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 == (LOGGER_LOG)0x0) {
            pIVar3 = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)0x0;
          }
          else {
            pIVar3 = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *)0x0;
            (*p_Var4)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                      ,"IoTHubClientCore_LL_CreateFromDeviceAuth",0x551,1,"initialize iothub client"
                     );
          }
        }
      }
      free(pcVar2);
      free(local_40);
      free(client_config);
      return pIVar3;
    }
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0;
    }
    pcVar2 = "Malloc failed";
    iVar5 = 0x511;
  }
  (*p_Var4)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
            ,"IoTHubClientCore_LL_CreateFromDeviceAuth",iVar5,1,pcVar2);
  return (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0;
}

Assistant:

IOTHUB_CLIENT_CORE_LL_HANDLE IoTHubClientCore_LL_CreateFromDeviceAuth(const char* iothub_uri, const char* device_id, IOTHUB_CLIENT_TRANSPORT_PROVIDER protocol)
{
    IOTHUB_CLIENT_CORE_LL_HANDLE result;
    if (iothub_uri == NULL || protocol == NULL || device_id == NULL)
    {
        LogError("Input parameter is NULL: iothub_uri: %p  protocol: %p device_id: %p", iothub_uri, protocol, device_id);
        result = NULL;
    }
    else
    {
#ifdef USE_PROV_MODULE
        IOTHUB_CLIENT_CONFIG* config = (IOTHUB_CLIENT_CONFIG*)malloc(sizeof(IOTHUB_CLIENT_CONFIG));
        if (config == NULL)
        {
            LogError("Malloc failed");
            result = NULL;
        }
        else
        {
            const char* iterator;
            const char* initial;
            char* iothub_name = NULL;
            char* iothub_suffix = NULL;

            memset(config, 0, sizeof(IOTHUB_CLIENT_CONFIG));
            config->protocol = protocol;
            config->deviceId = device_id;

            // Find the iothub suffix
            initial = iterator = iothub_uri;
            while (iterator != NULL && *iterator != '\0')
            {
                if (*iterator == '.')
                {
                    size_t length = safe_subtract_size_t(iterator, initial);
                    size_t calloc_size = safe_add_size_t(length, 1);
                    if (calloc_size != SIZE_MAX &&
                        (iothub_name = (char*)calloc(1, calloc_size)) != NULL)
                    {
                        memcpy(iothub_name, initial, length);
                        config->iotHubName = iothub_name;

                        length = safe_subtract_size_t(safe_subtract_size_t(strlen(initial), length), 1);
                        calloc_size = safe_add_size_t(length, 1);
                        if (calloc_size != SIZE_MAX &&
                            (iothub_suffix = (char*)calloc(1, calloc_size)) != NULL)
                        {
                            memcpy(iothub_suffix, iterator + 1, length);
                            config->iotHubSuffix = iothub_suffix;
                            break;
                        }
                        else
                        {
                            LogError("Failed to allocate iothub suffix, size:%zu", calloc_size);
                            free(iothub_name);
                            iothub_name = NULL;
                            result = NULL;
                        }
                    }
                    else
                    {
                        LogError("Failed to allocate iothub name, size:%zu", calloc_size);
                        result = NULL;
                    }
                }
                iterator++;
            }

            if (config->iotHubName == NULL || config->iotHubSuffix == NULL)
            {
                LogError("initialize iothub client");
                result = NULL;
            }
            else
            {
                IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* handleData = initialize_iothub_client(config, NULL, true, NULL);
                if (handleData == NULL)
                {
                    LogError("initialize iothub client");
                    result = NULL;
                }
                else
                {
                    result = handleData;
                }
            }

            free(iothub_name);
            free(iothub_suffix);
            free(config);
        }
#else
        LogError("HSM module is not included");
        result = NULL;
#endif
    }
    return result;
}